

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int update_it_envelope(IT_PLAYING *playing,IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe,int flags)

{
  int iVar1;
  uint uVar2;
  byte in_CL;
  IT_PLAYING_ENVELOPE *in_RDX;
  IT_ENVELOPE *in_RSI;
  uint *in_RDI;
  int t;
  int ye;
  int te;
  int ts;
  int ys;
  
  if (((*(byte *)((long)in_RDI + 0x4b) & in_CL) != 0) && (in_RSI->n_nodes != '\0')) {
    if (in_RDX->tick < 1) {
      in_RDX->value = (int)in_RSI->node_y[0] << 8;
    }
    else if (in_RDX->tick < (int)(uint)in_RSI->node_t[(int)(in_RSI->n_nodes - 1)]) {
      iVar1 = in_RSI->node_y[in_RDX->next_node + -1] * 0x100;
      uVar2 = (uint)in_RSI->node_t[in_RDX->next_node + -1];
      if (uVar2 == in_RSI->node_t[in_RDX->next_node]) {
        in_RDX->value = iVar1;
      }
      else {
        in_RDX->value =
             iVar1 + (int)((in_RSI->node_y[in_RDX->next_node] * 0x100 +
                           in_RSI->node_y[in_RDX->next_node + -1] * -0x100) * (in_RDX->tick - uVar2)
                          ) / (int)(in_RSI->node_t[in_RDX->next_node] - uVar2);
      }
    }
    else {
      in_RDX->value = (int)in_RSI->node_y[(int)(in_RSI->n_nodes - 1)] << 8;
    }
    in_RDX->tick = in_RDX->tick + 1;
    recalculate_it_envelope_node(in_RDX,in_RSI);
    if (((in_RSI->flags & 4) == 0) || ((*in_RDI & 2) != 0)) {
      if ((in_RSI->flags & 2) == 0) {
        if ((int)(uint)in_RSI->node_t[(int)(in_RSI->n_nodes - 1)] < in_RDX->tick) {
          return 1;
        }
      }
      else if ((int)(uint)in_RSI->node_t[in_RSI->loop_end] < in_RDX->tick) {
        in_RDX->next_node = in_RSI->loop_start + 1;
        in_RDX->tick = (uint)in_RSI->node_t[in_RSI->loop_start];
        return 0;
      }
    }
    else if ((int)(uint)in_RSI->node_t[in_RSI->sus_loop_end] < in_RDX->tick) {
      in_RDX->next_node = in_RSI->sus_loop_start + 1;
      in_RDX->tick = (uint)in_RSI->node_t[in_RSI->sus_loop_start];
      return 0;
    }
  }
  return 0;
}

Assistant:

static int update_it_envelope(IT_PLAYING *playing, IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe, int flags)
{
	if (!(playing->enabled_envelopes & flags) || !envelope->n_nodes)
		return 0;

	ASSERT(envelope->n_nodes > 0);

	if (pe->tick <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->tick >= envelope->node_t[envelope->n_nodes-1]) {
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	} else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}

	pe->tick++;

	recalculate_it_envelope_node(pe, envelope);

	if ((envelope->flags & IT_ENVELOPE_SUSTAIN_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		if (pe->tick > envelope->node_t[envelope->sus_loop_end]) {
			pe->next_node = envelope->sus_loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->sus_loop_start];
			return 0;
		}
	} else if (envelope->flags & IT_ENVELOPE_LOOP_ON) {
		if (pe->tick > envelope->node_t[envelope->loop_end]) {
			pe->next_node = envelope->loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->loop_start];
			return 0;
		}
	}
	else if (pe->tick > envelope->node_t[envelope->n_nodes - 1])
		return 1;

	return 0;
}